

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

Expression_node * __thiscall
lossless_neural_sound::expression_compiler::expression::Transfer_function::
get_derivative_implementation(Transfer_function *this,Arena *arena,Nodes *nodes,Variable *variable)

{
  int iVar1;
  _Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *ppEVar2;
  undefined4 extraout_var;
  Expression_node *pEVar3;
  Variable *local_90;
  Transfer_function *local_88;
  mapped_type local_80;
  Expression_node *local_78;
  Transfer_function local_70;
  
  local_70.arg = this->arg;
  local_70.derivative_count = this->derivative_count + 1;
  local_70.super_Expression_node.aa_tree_node.left_child = (Expression_node *)0x0;
  local_70.super_Expression_node.aa_tree_node.right_child = (Expression_node *)0x0;
  local_70.super_Expression_node.super_Node.hash_next = (Node *)0x0;
  local_70.super_Expression_node.aa_tree_node.parent = (Expression_node *)0x0;
  local_70.super_Expression_node.aa_tree_node.tree_size = 1;
  local_70.super_Expression_node.aa_tree_node.tree_level = 1;
  local_70.super_Expression_node.super_Node._vptr_Node = (_func_int **)&PTR__Node_00127cf0;
  local_88 = Nodes::
             intern<lossless_neural_sound::expression_compiler::expression::Transfer_function>
                       (nodes,arena,&local_70);
  pEVar3 = this->arg;
  local_90 = variable;
  local_78 = pEVar3;
  this_00 = (_Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)std::__detail::
               _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&nodes->derivative_cache,&local_78);
  ppEVar2 = std::__detail::
            _Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[](this_00,&local_90);
  local_80 = *ppEVar2;
  if (local_80 == (mapped_type)0x0) {
    iVar1 = (*(pEVar3->super_Node)._vptr_Node[10])(pEVar3,arena,nodes,local_90);
    local_80 = (mapped_type)CONCAT44(extraout_var,iVar1);
    *ppEVar2 = local_80;
  }
  pEVar3 = Product::make(arena,nodes,(Expression_node **)&local_88,2);
  return pEVar3;
}

Assistant:

virtual const Expression_node *get_derivative_implementation(
        Arena &arena, Nodes &nodes, const Variable *variable) const override
    {
        return Product::make(arena,
                             nodes,
                             {nodes.intern(arena, Transfer_function(arg, derivative_count + 1)),
                              arg->get_derivative(arena, nodes, variable)});
    }